

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * GenImagePerlinNoise(Image *__return_storage_ptr__,int width,int height,int offsetX,
                           int offsetY,float scale)

{
  undefined1 uVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  int iVar6;
  float fVar7;
  float z;
  float fVar8;
  float fVar9;
  
  pvVar2 = malloc((long)(height * width) << 2);
  if (0 < height) {
    uVar5 = 0;
    do {
      if (0 < width) {
        lVar3 = uVar5 * (uint)width;
        uVar4 = 0;
        do {
          iVar6 = 0;
          fVar8 = 0.0;
          fVar9 = 1.0;
          z = 1.0;
          do {
            fVar7 = stb_perlin_noise3_internal
                              ((((float)((int)uVar4 + offsetX) * scale) / (float)width) * z,
                               (((float)(offsetY + (int)uVar5) * scale) / (float)height) * z,z,0,0,0
                               ,(uchar)iVar6);
            fVar8 = fVar8 + fVar7 * fVar9;
            z = z + z;
            fVar9 = fVar9 * 0.5;
            iVar6 = iVar6 + 1;
          } while (iVar6 != 6);
          uVar1 = (undefined1)(int)((fVar8 + 1.0) * 0.5 * 255.0);
          *(undefined1 *)((long)pvVar2 + uVar4 * 4 + lVar3 * 4) = uVar1;
          *(undefined1 *)((long)pvVar2 + uVar4 * 4 + lVar3 * 4 + 1) = uVar1;
          *(undefined1 *)((long)pvVar2 + uVar4 * 4 + lVar3 * 4 + 2) = uVar1;
          *(undefined1 *)((long)pvVar2 + uVar4 * 4 + lVar3 * 4 + 3) = 0xff;
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uint)width);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)height);
  }
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImagePerlinNoise(int width, int height, int offsetX, int offsetY, float scale)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            float nx = (float)(x + offsetX)*scale/(float)width;
            float ny = (float)(y + offsetY)*scale/(float)height;

            // Typical values to start playing with:
            //   lacunarity = ~2.0   -- spacing between successive octaves (use exactly 2.0 for wrapping output)
            //   gain       =  0.5   -- relative weighting applied to each successive octave
            //   octaves    =  6     -- number of "octaves" of noise3() to sum

            // NOTE: We need to translate the data from [-1..1] to [0..1]
            float p = (stb_perlin_fbm_noise3(nx, ny, 1.0f, 2.0f, 0.5f, 6) + 1.0f)/2.0f;

            int intensity = (int)(p*255.0f);
            pixels[y*width + x] = (Color){intensity, intensity, intensity, 255};
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}